

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElectricityBill.cpp
# Opt level: O2

void __thiscall ElectricityBill::QueryBill(ElectricityBill *this,Timer *timer)

{
  string *psVar1;
  size_t *this_00;
  pointer pRVar2;
  LogLevel LVar3;
  Logger *pLVar4;
  pointer room_info;
  undefined1 local_82e8 [8];
  FileForAppend file;
  undefined1 local_a0 [8];
  string result;
  string room_file_path;
  
  LVar3 = higan::Logger::GetLogLevel();
  if ((int)LVar3 < 2) {
    higan::Logger::Logger
              ((Logger *)local_82e8,INFO,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/example/ElectricityBill/ElectricityBill.cpp"
               ,0x84,"QueryBill");
    higan::Logger::operator<<((Logger *)local_82e8,"----------Query Bill Start------------");
    higan::Logger::~Logger((Logger *)local_82e8);
  }
  pRVar2 = (this->room_informations_).super__Vector_base<RoomInfo,_std::allocator<RoomInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  this_00 = &file.write_sum_bytes_;
  for (room_info = (this->room_informations_).
                   super__Vector_base<RoomInfo,_std::allocator<RoomInfo>_>._M_impl.
                   super__Vector_impl_data._M_start; room_info != pRVar2; room_info = room_info + 1)
  {
    psVar1 = (string *)((long)&result.field_2 + 8);
    GetRoomFilePathInternal_abi_cxx11_(psVar1,this,room_info);
    higan::FileForAppend::FileForAppend((FileForAppend *)local_82e8,psVar1);
    DoQuery_abi_cxx11_((string *)local_a0,this,room_info);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   (string *)local_a0,'\n');
    higan::FileForAppend::Append((FileForAppend *)local_82e8,(string *)this_00);
    std::__cxx11::string::~string((string *)this_00);
    LVar3 = higan::Logger::GetLogLevel();
    if ((int)LVar3 < 2) {
      higan::Logger::Logger
                ((Logger *)this_00,INFO,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/example/ElectricityBill/ElectricityBill.cpp"
                 ,0x8e,"QueryBill");
      pLVar4 = higan::Logger::operator<<((Logger *)this_00,"Query Result: ");
      psVar1 = (string *)((long)&room_file_path.field_2 + 8);
      RoomInfo::GetRoomInfoString_abi_cxx11_(psVar1,room_info);
      pLVar4 = higan::Logger::operator<<(pLVar4,psVar1);
      pLVar4 = higan::Logger::operator<<(pLVar4," ");
      higan::Logger::operator<<(pLVar4,(string *)local_a0);
      std::__cxx11::string::~string((string *)(room_file_path.field_2._M_local_buf + 8));
      higan::Logger::~Logger((Logger *)this_00);
    }
    std::__cxx11::string::~string((string *)local_a0);
    higan::FileForAppend::~FileForAppend((FileForAppend *)local_82e8);
    std::__cxx11::string::~string((string *)(result.field_2._M_local_buf + 8));
  }
  LVar3 = higan::Logger::GetLogLevel();
  if ((int)LVar3 < 2) {
    higan::Logger::Logger
              ((Logger *)local_82e8,INFO,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/example/ElectricityBill/ElectricityBill.cpp"
               ,0x91,"QueryBill");
    higan::Logger::operator<<((Logger *)local_82e8,"----------Query Bill End------------");
    higan::Logger::~Logger((Logger *)local_82e8);
  }
  return;
}

Assistant:

void ElectricityBill::QueryBill(const higan::Timer& timer)
{
	LOG_INFO << "----------Query Bill Start------------";

	for (const auto & room_info : room_informations_)
	{
		std::string room_file_path = GetRoomFilePathInternal(room_info);

		higan::FileForAppend file(room_file_path);
		std::string result =  DoQuery(room_info);

		file.Append(result + '\n');
		LOG_INFO << "Query Result: " << room_info.GetRoomInfoString() << " " << result;
	}

	LOG_INFO << "----------Query Bill End------------";
}